

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint8_t uVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  uint32_t *puVar11;
  BrotliEncoderDictionary *pBVar12;
  HasherCommon *pHVar13;
  BrotliDictionary *pBVar14;
  int iVar15;
  ulong uVar16;
  ushort uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  uint8_t *puVar24;
  ulong *puVar25;
  ushort uVar26;
  int iVar27;
  uint32_t uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  size_t sVar37;
  long lVar38;
  ulong uVar39;
  uint8_t *puVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong *puVar47;
  int iVar48;
  ulong uVar49;
  ulong local_138;
  ulong local_f8;
  Command *local_f0;
  uint local_e4;
  ulong local_d0;
  ulong local_c0;
  uint local_90;
  
  uVar6 = (position - 7) + num_bytes;
  sVar37 = position;
  if (7 < num_bytes) {
    sVar37 = uVar6;
  }
  lVar38 = 0x200;
  if (params->quality < 9) {
    lVar38 = 0x40;
  }
  uVar45 = *last_insert_len;
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 8) {
    local_f0 = commands;
LAB_0030af69:
    *last_insert_len = (uVar45 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_f0 - (long)commands >> 4);
    return;
  }
  uVar32 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  sVar9 = params->stream_offset;
  sVar10 = (params->dictionary).compound.total_size;
  uVar34 = lVar38 + position;
  puVar11 = (hasher->privat)._H2.buckets_;
  lVar1 = sVar10 + 1;
  lVar5 = position - 1;
  local_f0 = commands;
  uVar31 = position;
LAB_0030a08f:
  uVar21 = uVar32;
  if (uVar31 < uVar32) {
    uVar21 = uVar31;
  }
  uVar20 = sVar9 + uVar31;
  if (uVar32 <= sVar9 + uVar31) {
    uVar20 = uVar32;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e4 = 0;
    local_c0 = 0;
  }
  else {
    if (uVar31 == 0) {
      local_c0 = 0;
LAB_0030a0e9:
      uVar23 = 0;
    }
    else {
      local_c0 = (ulong)ringbuffer[uVar31 - 1 & ringbuffer_mask];
      if (uVar31 == 1) goto LAB_0030a0e9;
      uVar23 = (ulong)ringbuffer[uVar31 - 2 & ringbuffer_mask];
    }
    local_e4 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[uVar23 + 0x100] | literal_context_lut[local_c0]];
  }
  local_138 = uVar2 - uVar31;
  pBVar12 = (params->dictionary).contextual.dict[local_e4];
  uVar23 = (params->dist).max_distance;
  uVar39 = uVar31 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar39);
  uVar7 = ringbuffer[uVar39];
  uVar39 = (ulong)(*(long *)(ringbuffer + uVar39) * 0x7bd3579bd3000000) >> 0x30;
  local_f8 = (ulong)*dist_cache;
  local_90 = (uint)ringbuffer_mask;
  if ((uVar31 - local_f8 < uVar31) &&
     (uVar36 = (uint)(uVar31 - local_f8) & local_90, uVar7 == ringbuffer[uVar36])) {
    puVar40 = ringbuffer + uVar36;
    puVar24 = puVar40;
    uVar43 = local_138;
    puVar47 = puVar3;
    if (7 < local_138) {
      lVar30 = 0;
      lVar42 = 0;
LAB_0030a195:
      if (*(ulong *)((long)puVar3 + lVar30) == *(ulong *)(puVar40 + lVar30)) goto code_r0x0030a1a2;
      uVar33 = *(ulong *)(puVar40 + lVar30) ^ *(ulong *)((long)puVar3 + lVar30);
      uVar43 = 0;
      if (uVar33 != 0) {
        for (; (uVar33 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
        }
      }
      uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar42;
      goto LAB_0030a229;
    }
    goto LAB_0030a1d2;
  }
  goto LAB_0030a25b;
code_r0x0030a1a2:
  lVar30 = lVar30 + 8;
  lVar46 = local_138 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar46 - 8U < 8) goto code_r0x0030a1bc;
  goto LAB_0030a195;
code_r0x0030a1bc:
  puVar24 = puVar40 + -lVar42;
  puVar47 = (ulong *)((long)puVar3 - lVar42);
  uVar43 = lVar42 + local_138;
LAB_0030a1d2:
  if (uVar43 != 0) {
    uVar33 = 0;
    do {
      uVar44 = uVar33;
      if (puVar24[uVar33] != *(uint8_t *)((long)puVar47 + uVar33)) break;
      uVar33 = uVar33 + 1;
      uVar44 = uVar43;
    } while (uVar43 != uVar33);
    puVar24 = puVar24 + uVar44;
  }
  uVar43 = (long)puVar24 - (long)puVar40;
LAB_0030a229:
  if ((3 < uVar43) && (uVar33 = uVar43 * 0x87 + 0x78f, 0x7e4 < uVar33)) {
    puVar11[uVar39] = (uint32_t)uVar31;
    iVar19 = 0;
    goto LAB_0030a375;
  }
LAB_0030a25b:
  uVar36 = puVar11[uVar39];
  puVar11[uVar39] = (uint32_t)uVar31;
  if (((uVar7 == ringbuffer[local_90 & uVar36]) && (uVar31 != uVar36)) &&
     (local_f8 = uVar31 - uVar36, local_f8 <= uVar21)) {
    puVar40 = ringbuffer + (local_90 & uVar36);
    puVar24 = puVar40;
    uVar21 = local_138;
    puVar47 = puVar3;
    if (7 < local_138) {
      lVar30 = 0;
      lVar42 = 0;
LAB_0030a2b3:
      if (*(ulong *)((long)puVar3 + lVar30) == *(ulong *)(puVar40 + lVar30)) goto code_r0x0030a2c0;
      uVar39 = *(ulong *)(puVar40 + lVar30) ^ *(ulong *)((long)puVar3 + lVar30);
      uVar21 = 0;
      if (uVar39 != 0) {
        for (; (uVar39 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      uVar43 = (uVar21 >> 3 & 0x1fffffff) - lVar42;
      goto LAB_0030a33c;
    }
    goto LAB_0030a2f0;
  }
LAB_0030a966:
  uVar45 = uVar45 + 1;
  position = uVar31 + 1;
  if (uVar34 < position) {
    if ((uint)((int)lVar38 * 4) + uVar34 < position) {
      uVar21 = uVar31 + 0x11;
      if (uVar6 <= uVar31 + 0x11) {
        uVar21 = uVar6;
      }
      for (; position < uVar21; position = position + 4) {
        puVar11[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) * 0x7bd3579bd3000000)
                >> 0x30] = (uint32_t)position;
        uVar45 = uVar45 + 4;
      }
    }
    else {
      uVar21 = uVar31 + 9;
      if (uVar6 <= uVar31 + 9) {
        uVar21 = uVar6;
      }
      for (; position < uVar21; position = position + 2) {
        puVar11[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) * 0x7bd3579bd3000000)
                >> 0x30] = (uint32_t)position;
        uVar45 = uVar45 + 2;
      }
    }
  }
LAB_0030a9f1:
  uVar31 = position;
  if (uVar2 <= position + 8) goto LAB_0030af69;
  goto LAB_0030a08f;
code_r0x0030a2c0:
  lVar30 = lVar30 + 8;
  lVar46 = local_138 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar46 - 8U < 8) goto code_r0x0030a2da;
  goto LAB_0030a2b3;
code_r0x0030a2da:
  puVar24 = puVar40 + -lVar42;
  puVar47 = (ulong *)((long)puVar3 - lVar42);
  uVar21 = lVar42 + local_138;
LAB_0030a2f0:
  if (uVar21 != 0) {
    uVar39 = 0;
    do {
      uVar43 = uVar39;
      if (puVar24[uVar39] != *(uint8_t *)((long)puVar47 + uVar39)) break;
      uVar39 = uVar39 + 1;
      uVar43 = uVar21;
    } while (uVar21 != uVar39);
    puVar24 = puVar24 + uVar43;
  }
  uVar43 = (long)puVar24 - (long)puVar40;
LAB_0030a33c:
  if (3 < uVar43) {
    iVar19 = 0x1f;
    if ((uint)local_f8 != 0) {
      for (; (uint)local_f8 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar33 = (ulong)(iVar19 * -0x1e + 0x780) + uVar43 * 0x87;
    iVar19 = 0;
    if (0x7e4 < uVar33) goto LAB_0030a375;
  }
  pHVar13 = (hasher->privat)._H2.common;
  if (pHVar13->dict_num_lookups >> 7 <= pHVar13->dict_num_matches) {
    uVar39 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x12);
    puVar24 = pBVar12->hash_table_lengths;
    pHVar13->dict_num_lookups = pHVar13->dict_num_lookups + 1;
    bVar22 = puVar24[uVar39 * 2];
    uVar21 = (ulong)bVar22;
    if ((uVar21 != 0) && (uVar21 <= local_138)) {
      pBVar14 = pBVar12->words;
      puVar25 = (ulong *)(pBVar14->data +
                         (ulong)pBVar14->offsets_by_length[uVar21] +
                         pBVar12->hash_table_words[uVar39 * 2] * uVar21);
      puVar47 = puVar3;
      uVar43 = uVar21;
      if (7 < bVar22) {
        lVar30 = 0;
LAB_0030ab35:
        if (*puVar25 == *puVar47) goto code_r0x0030ab44;
        uVar33 = *puVar47 ^ *puVar25;
        uVar43 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
          }
        }
        uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar30;
        goto LAB_0030ae51;
      }
      goto LAB_0030ac9e;
    }
  }
  goto LAB_0030a966;
code_r0x0030ab44:
  puVar25 = puVar25 + 1;
  puVar47 = puVar47 + 1;
  lVar42 = uVar21 + lVar30;
  lVar30 = lVar30 + -8;
  if (lVar42 - 8U < 8) goto code_r0x0030ab5e;
  goto LAB_0030ab35;
code_r0x0030ab5e:
  uVar43 = lVar30 + uVar21;
  if (lVar30 + uVar21 != 0) {
LAB_0030ac9e:
    uVar33 = 0;
    do {
      uVar44 = uVar33;
      if (*(char *)((long)puVar47 + uVar33) != *(char *)((long)puVar25 + uVar33)) break;
      uVar33 = uVar33 + 1;
      uVar44 = uVar43;
    } while (uVar43 != uVar33);
    puVar47 = (ulong *)((long)puVar47 + uVar44);
  }
  uVar43 = (long)puVar47 - (long)puVar3;
LAB_0030ae51:
  if (((uVar43 != 0) && (uVar21 < pBVar12->cutoffTransformsCount + uVar43)) &&
     (local_f8 = uVar20 + lVar1 + (ulong)pBVar12->hash_table_words[uVar39 * 2] +
                 ((ulong)((uint)(pBVar12->cutoffTransforms >>
                                ((char)(uVar21 - uVar43) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar21 - uVar43) * 4 << (pBVar14->size_bits_by_length[uVar21] & 0x3f)),
     local_f8 <= uVar23)) {
    iVar19 = 0x1f;
    if ((uint)local_f8 != 0) {
      for (; (uint)local_f8 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar33 = (uVar43 * 0x87 - (ulong)(uint)(iVar19 * 0x1e)) + 0x780;
    if ((0x7e3 < uVar33) &&
       (pHVar13->dict_num_matches = pHVar13->dict_num_matches + 1, uVar33 != 0x7e4)) {
      iVar19 = (uint)bVar22 - (int)uVar43;
LAB_0030a375:
      iVar8 = *dist_cache;
      lVar30 = (lVar5 + num_bytes) - uVar31;
      iVar27 = 0;
      uVar34 = uVar45;
LAB_0030a3a6:
      local_138 = local_138 - 1;
      uVar21 = uVar43 - 1;
      if (local_138 <= uVar43 - 1) {
        uVar21 = local_138;
      }
      if (4 < params->quality) {
        uVar21 = 0;
      }
      uVar20 = uVar31 + 1;
      uVar39 = uVar32;
      if (uVar20 < uVar32) {
        uVar39 = uVar20;
      }
      local_d0 = sVar9 + uVar31 + 1;
      if (uVar32 <= local_d0) {
        local_d0 = uVar32;
      }
      if ((params->dictionary).contextual.context_based != 0) {
        local_e4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[local_c0 + 0x100] |
                          literal_context_lut[ringbuffer[uVar31 & ringbuffer_mask]]];
        local_c0 = (ulong)ringbuffer[uVar31 & ringbuffer_mask];
      }
      pBVar12 = (params->dictionary).contextual.dict[local_e4];
      puVar3 = (ulong *)(ringbuffer + (uVar20 & ringbuffer_mask));
      uVar7 = *(uint8_t *)(uVar21 + (long)puVar3);
      uVar49 = (ulong)(*(long *)(ringbuffer + (uVar20 & ringbuffer_mask)) * 0x7bd3579bd3000000) >>
               0x30;
      uVar44 = uVar20 - (long)iVar8;
      if ((uVar44 < uVar20) &&
         (puVar24 = ringbuffer + ((uint)uVar44 & local_90), uVar7 == puVar24[uVar21])) {
        puVar40 = puVar24;
        puVar47 = puVar3;
        uVar44 = local_138;
        if (7 < local_138) {
          lVar42 = 0;
          lVar46 = 0;
LAB_0030a4e5:
          if (*(ulong *)((long)puVar3 + lVar42) == *(ulong *)(puVar24 + lVar42))
          goto code_r0x0030a4f2;
          uVar41 = *(ulong *)(puVar24 + lVar42) ^ *(ulong *)((long)puVar3 + lVar42);
          uVar44 = 0;
          if (uVar41 != 0) {
            for (; (uVar41 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar44 = (uVar44 >> 3 & 0x1fffffff) - lVar46;
          goto LAB_0030a580;
        }
        goto LAB_0030a51c;
      }
      goto LAB_0030a5b8;
    }
  }
  goto LAB_0030a966;
code_r0x0030a4f2:
  lVar42 = lVar42 + 8;
  lVar4 = lVar46 + lVar30;
  lVar46 = lVar46 + -8;
  if (lVar4 - 8U < 8) goto code_r0x0030a508;
  goto LAB_0030a4e5;
code_r0x0030a508:
  puVar40 = puVar24 + -lVar46;
  puVar47 = (ulong *)((long)puVar3 - lVar46);
  uVar44 = lVar46 + lVar30;
LAB_0030a51c:
  if (uVar44 != 0) {
    uVar41 = 0;
    do {
      uVar16 = uVar41;
      if (puVar40[uVar41] != *(uint8_t *)((long)puVar47 + uVar41)) break;
      uVar41 = uVar41 + 1;
      uVar16 = uVar44;
    } while (uVar44 != uVar41);
    puVar40 = puVar40 + uVar16;
  }
  uVar44 = (long)puVar40 - (long)puVar24;
LAB_0030a580:
  if ((uVar44 < 4) || (uVar41 = uVar44 * 0x87 + 0x78f, uVar41 < 0x7e5)) {
LAB_0030a5b8:
    uVar36 = puVar11[uVar49];
    puVar11[uVar49] = (uint32_t)uVar20;
    puVar24 = ringbuffer + (local_90 & uVar36);
    if (uVar7 == puVar24[uVar21]) {
      iVar48 = 0;
      if ((uVar20 == uVar36) || (uVar49 = uVar20 - uVar36, uVar39 < uVar49)) {
        uVar41 = 0x7e4;
        uVar49 = 0;
        uVar39 = uVar21;
        goto LAB_0030a758;
      }
      uVar39 = local_138;
      puVar40 = puVar24;
      puVar47 = puVar3;
      if (7 < local_138) {
        lVar46 = 0;
        lVar42 = 0;
LAB_0030a61b:
        if (*(ulong *)((long)puVar3 + lVar46) == *(ulong *)(puVar24 + lVar46))
        goto code_r0x0030a628;
        uVar44 = *(ulong *)(puVar24 + lVar46) ^ *(ulong *)((long)puVar3 + lVar46);
        uVar39 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
        uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_0030a6b4;
      }
      goto LAB_0030a64d;
    }
    uVar41 = 0x7e4;
    uVar49 = 0;
  }
  else {
    puVar11[uVar49] = (uint32_t)uVar20;
    uVar49 = (long)iVar8;
    uVar21 = uVar44;
  }
  iVar48 = 0;
  uVar39 = uVar21;
  goto LAB_0030a758;
code_r0x0030a628:
  lVar46 = lVar46 + 8;
  lVar4 = lVar42 + lVar30;
  lVar42 = lVar42 + -8;
  if (lVar4 - 8U < 8) goto code_r0x0030a63e;
  goto LAB_0030a61b;
code_r0x0030a63e:
  puVar40 = puVar24 + -lVar42;
  puVar47 = (ulong *)((long)puVar3 - lVar42);
  uVar39 = lVar42 + lVar30;
LAB_0030a64d:
  if (uVar39 != 0) {
    uVar44 = 0;
    do {
      uVar41 = uVar44;
      if (puVar40[uVar44] != *(uint8_t *)((long)puVar47 + uVar44)) break;
      uVar44 = uVar44 + 1;
      uVar41 = uVar39;
    } while (uVar39 != uVar44);
    puVar40 = puVar40 + uVar41;
  }
  uVar39 = (long)puVar40 - (long)puVar24;
LAB_0030a6b4:
  if (3 < uVar39) {
    iVar15 = 0x1f;
    if ((uint)uVar49 != 0) {
      for (; (uint)uVar49 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    uVar41 = (ulong)(iVar15 * -0x1e + 0x780) + uVar39 * 0x87;
    if (0x7e4 < uVar41) goto LAB_0030a758;
  }
  pHVar13 = (hasher->privat)._H2.common;
  if (pHVar13->dict_num_lookups >> 7 <= pHVar13->dict_num_matches) {
    uVar44 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x12);
    puVar24 = pBVar12->hash_table_lengths;
    pHVar13->dict_num_lookups = pHVar13->dict_num_lookups + 1;
    bVar22 = puVar24[uVar44 * 2];
    uVar49 = (ulong)bVar22;
    if ((uVar49 != 0) && (uVar49 <= local_138)) {
      pBVar14 = pBVar12->words;
      puVar25 = (ulong *)(pBVar14->data +
                         (ulong)pBVar14->offsets_by_length[uVar49] +
                         pBVar12->hash_table_words[uVar44 * 2] * uVar49);
      uVar39 = uVar49;
      puVar47 = puVar3;
      if (7 < bVar22) {
        lVar42 = 0;
LAB_0030a7e5:
        if (*puVar25 == *puVar47) goto code_r0x0030a7f0;
        uVar41 = *puVar47 ^ *puVar25;
        uVar39 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
          }
        }
        uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_0030a850;
      }
      goto LAB_0030a817;
    }
  }
LAB_0030a753:
  iVar48 = 0;
  uVar49 = 0;
  uVar41 = 0x7e4;
  uVar39 = uVar21;
  goto LAB_0030a758;
code_r0x0030a7f0:
  puVar25 = puVar25 + 1;
  puVar47 = puVar47 + 1;
  lVar46 = uVar49 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar46 - 8U < 8) goto code_r0x0030a80a;
  goto LAB_0030a7e5;
code_r0x0030a80a:
  uVar39 = lVar42 + uVar49;
  if (lVar42 + uVar49 != 0) {
LAB_0030a817:
    uVar41 = 0;
    do {
      uVar16 = uVar41;
      if (*(char *)((long)puVar47 + uVar41) != *(char *)((long)puVar25 + uVar41)) break;
      uVar41 = uVar41 + 1;
      uVar16 = uVar39;
    } while (uVar39 != uVar41);
    puVar47 = (ulong *)((long)puVar47 + uVar16);
  }
  uVar39 = (long)puVar47 - (long)puVar3;
LAB_0030a850:
  if ((uVar39 != 0) && (uVar49 < pBVar12->cutoffTransformsCount + uVar39)) {
    uVar49 = (ulong)pBVar12->hash_table_words[uVar44 * 2] + lVar1 + local_d0 +
             ((ulong)((uint)(pBVar12->cutoffTransforms >> ((char)(uVar49 - uVar39) * '\x06' & 0x3fU)
                            ) & 0x3f) + (uVar49 - uVar39) * 4 <<
             (pBVar14->size_bits_by_length[uVar49] & 0x3f));
    if (uVar23 < uVar49) goto LAB_0030a753;
    iVar48 = 0x1f;
    if ((uint)uVar49 != 0) {
      for (; (uint)uVar49 >> iVar48 == 0; iVar48 = iVar48 + -1) {
      }
    }
    uVar41 = (uVar39 * 0x87 - (ulong)(uint)(iVar48 * 0x1e)) + 0x780;
    if (0x7e3 < uVar41) {
      iVar48 = (uint)bVar22 - (int)uVar39;
      pHVar13->dict_num_matches = pHVar13->dict_num_matches + 1;
      goto LAB_0030a758;
    }
  }
  iVar48 = 0;
  uVar41 = 0x7e4;
  uVar49 = 0;
  uVar39 = uVar21;
LAB_0030a758:
  if (uVar41 < uVar33 + 0xaf) {
    uVar49 = local_f8;
    uVar20 = uVar31;
    uVar39 = uVar43;
    uVar21 = uVar34;
    local_d0 = uVar31 + sVar9;
    iVar48 = iVar19;
    if (uVar32 <= uVar31 + sVar9) {
      local_d0 = uVar32;
    }
    goto LAB_0030aa8d;
  }
  uVar21 = uVar45 + 4;
  if (iVar27 == 3) goto LAB_0030aa8d;
  uVar21 = uVar34 + 1;
  iVar27 = iVar27 + 1;
  uVar44 = uVar31 + 9;
  lVar30 = lVar30 + -1;
  uVar43 = uVar39;
  uVar31 = uVar20;
  local_f8 = uVar49;
  uVar33 = uVar41;
  uVar34 = uVar21;
  iVar19 = iVar48;
  if (uVar2 <= uVar44) goto LAB_0030aa8d;
  goto LAB_0030a3a6;
LAB_0030aa8d:
  local_d0 = local_d0 + sVar10;
  if (local_d0 < uVar49) {
LAB_0030aaa6:
    uVar45 = uVar49 + 0xf;
LAB_0030aaaa:
    if ((uVar49 <= local_d0) && (uVar45 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)uVar49;
    }
  }
  else {
    if (uVar49 != (long)*dist_cache) {
      uVar45 = 1;
      if (uVar49 != (long)dist_cache[1]) {
        uVar45 = (uVar49 + 3) - (long)*dist_cache;
        if (uVar45 < 7) {
          bVar22 = (byte)((int)uVar45 << 2);
          uVar36 = 0x9750468;
        }
        else {
          uVar45 = (uVar49 + 3) - (long)dist_cache[1];
          if (6 < uVar45) {
            uVar45 = 2;
            if ((uVar49 != (long)dist_cache[2]) && (uVar45 = 3, uVar49 != (long)dist_cache[3]))
            goto LAB_0030aaa6;
            goto LAB_0030aaaa;
          }
          bVar22 = (byte)((int)uVar45 << 2);
          uVar36 = 0xfdb1ace;
        }
        uVar45 = (ulong)(uVar36 >> (bVar22 & 0x1f) & 0xf);
      }
      goto LAB_0030aaaa;
    }
    uVar45 = 0;
  }
  uVar36 = (uint)uVar21;
  local_f0->insert_len_ = uVar36;
  local_f0->copy_len_ = iVar48 << 0x19 | (uint)uVar39;
  uVar31 = (ulong)(params->dist).num_direct_distance_codes;
  uVar34 = uVar31 + 0x10;
  uVar28 = 0;
  if (uVar34 <= uVar45) {
    uVar35 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar35;
    uVar31 = ((4L << (bVar22 & 0x3f)) + (uVar45 - uVar31)) - 0x10;
    uVar18 = 0x1f;
    uVar29 = (uint)uVar31;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) + 0x1f;
    uVar23 = (ulong)((uVar31 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
    lVar30 = (ulong)uVar18 - (ulong)uVar35;
    uVar45 = (~(-1 << (bVar22 & 0x1f)) & uVar29) + uVar34 +
             (uVar23 + lVar30 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar30 * 0x400;
    uVar28 = (uint32_t)(uVar31 - (uVar23 + 2 << ((byte)uVar18 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_f0->dist_prefix_ = (uint16_t)uVar45;
  local_f0->dist_extra_ = uVar28;
  if (5 < uVar21) {
    if (uVar21 < 0x82) {
      uVar36 = 0x1f;
      uVar35 = (uint)(uVar21 - 2);
      if (uVar35 != 0) {
        for (; uVar35 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar36 = (int)(uVar21 - 2 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar36 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar21 < 0x842) {
      uVar35 = 0x1f;
      if (uVar36 - 0x42 != 0) {
        for (; uVar36 - 0x42 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar36 = (uVar35 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar36 = 0x15;
      if (0x1841 < uVar21) {
        uVar36 = (uint)(ushort)(0x17 - (uVar21 < 0x5842));
      }
    }
  }
  uVar35 = iVar48 + (uint)uVar39;
  if (uVar35 < 10) {
    uVar18 = uVar35 - 2;
  }
  else if (uVar35 < 0x86) {
    uVar35 = uVar35 - 6;
    uVar18 = 0x1f;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar35 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar18 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar18 = 0x17;
    if (uVar35 < 0x846) {
      uVar18 = 0x1f;
      if (uVar35 - 0x46 != 0) {
        for (; uVar35 - 0x46 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (uVar18 ^ 0xffe0) + 0x2c;
    }
  }
  uVar17 = (ushort)uVar18;
  uVar26 = (uVar17 & 7) + ((ushort)uVar36 & 7) * 8;
  if ((((uVar45 & 0x3ff) == 0) && ((ushort)uVar36 < 8)) && (uVar17 < 0x10)) {
    if (7 < uVar17) {
      uVar26 = uVar26 | 0x40;
    }
  }
  else {
    iVar19 = ((uVar36 & 0xffff) >> 3) * 3 + ((uVar18 & 0xffff) >> 3);
    uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar19 * 0x40 + 0x40;
  }
  local_f0->cmd_prefix_ = uVar26;
  *num_literals = *num_literals + uVar21;
  position = uVar39 + uVar20;
  uVar45 = sVar37;
  if (position < sVar37) {
    uVar45 = position;
  }
  uVar31 = uVar20 + 2;
  if (uVar49 < uVar39 >> 2) {
    uVar34 = position + uVar49 * -4;
    if (uVar34 < uVar31) {
      uVar34 = uVar31;
    }
    uVar31 = uVar34;
    if (uVar45 < uVar34) {
      uVar31 = uVar45;
    }
  }
  uVar34 = uVar20 + lVar38 + uVar39 * 2;
  local_f0 = local_f0 + 1;
  if (uVar31 < uVar45) {
    do {
      puVar11[(ulong)(*(long *)(ringbuffer + (uVar31 & ringbuffer_mask)) * 0x7bd3579bd3000000) >>
              0x30] = (uint32_t)uVar31;
      uVar31 = uVar31 + 1;
    } while (uVar45 != uVar31);
    uVar45 = 0;
  }
  else {
    uVar45 = 0;
  }
  goto LAB_0030a9f1;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}